

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

bool rcg::convertImage(uint8_t *rgb_out,uint8_t *mono_out,uint8_t *raw,uint64_t pixelformat,
                      size_t width,size_t height,size_t xpadding)

{
  pointer puVar1;
  uint8_t uVar2;
  long lVar3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_RCX;
  void *in_RDX;
  undefined1 *puVar4;
  uint8_t *puVar5;
  uint8_t *in_RSI;
  undefined1 *in_RDI;
  ulong in_R8;
  ulong in_R9;
  long in_stack_00000008;
  uint8_t *p;
  size_t k_4;
  uint8_t *row [3];
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffer;
  bool red;
  bool greenfirst;
  size_t i_3;
  size_t j_4;
  size_t k_3;
  size_t j_3;
  int j_2;
  uint8_t rgb_1 [12];
  size_t i_2;
  size_t k_2;
  size_t pstep_1;
  size_t j_1;
  int j;
  uint8_t rgb [12];
  size_t i_1;
  size_t k_1;
  size_t pstep;
  uint8_t v;
  size_t i;
  size_t k;
  bool ret;
  uchar *in_stack_fffffffffffffec8;
  bool greenfirst_00;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  bool bVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  uint8_t *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  uint8_t *in_stack_fffffffffffffef8;
  uint8_t *in_stack_ffffffffffffff00;
  ulong uVar9;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  int local_a8;
  undefined1 local_a4 [12];
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  int local_78;
  undefined1 local_74 [12];
  ulong local_68;
  ulong local_60;
  long local_58;
  undefined1 local_49;
  ulong local_48;
  ulong local_40;
  byte local_31;
  ulong local_30;
  ulong local_28;
  void *local_18;
  uint8_t *local_10;
  undefined1 *local_8;
  
  local_31 = 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RCX != (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x1080001) {
    if (in_RCX + -0x210001 <
        (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x4) {
      uVar8 = in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        0x1080008 ||
              in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        0x108000a;
      bVar6 = in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        0x1080009 ||
              in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        0x1080008;
      uVar7 = bVar6;
      operator_new__((in_R8 + 2) * 3);
      std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
      unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_f8 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                           (in_stack_fffffffffffffed0);
      uVar9 = local_28;
      local_f0 = local_f8 + local_28 + 2;
      local_e8 = local_f0 + local_28 + 2;
      memcpy(local_f8 + local_28 + 3,(void *)((long)local_18 + in_stack_00000008 + local_28),
             local_28);
      memcpy(local_f0 + uVar9 + 3,local_18,local_28);
      *local_f0 = local_f8[uVar9 + 4];
      local_f8[local_28 + uVar9 + 3] = local_f0[local_28 - 1];
      *local_e8 = local_f0[uVar9 + 4];
      local_f0[local_28 + uVar9 + 3] = local_e8[local_28 - 1];
      for (uVar9 = 0; puVar1 = local_f8, uVar9 < local_30; uVar9 = uVar9 + 1) {
        if (uVar9 + 1 < local_30) {
          local_f8 = local_f0;
          local_f0 = local_e8;
          local_e8 = puVar1;
          memcpy(puVar1 + 1,(void *)((long)local_18 + (uVar9 + 1) * (local_28 + in_stack_00000008)),
                 local_28);
          *puVar1 = puVar1[2];
          puVar1[local_28 + 1] = puVar1[local_28 - 1];
        }
        greenfirst_00 = SUB81(local_28 >> 0x38,0);
        if (bVar6) {
          anon_unknown_4::convertBayerGR
                    ((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,(uint8_t *)in_RCX,
                     (uint8_t *)CONCAT17(uVar8,CONCAT16(uVar7,in_stack_fffffffffffffed8)),
                     (uint8_t *)in_stack_fffffffffffffed0,greenfirst_00,uVar9);
          if (local_8 != (undefined1 *)0x0) {
            local_8 = local_8 + local_28 * 3;
          }
          if (local_10 != (uint8_t *)0x0) {
            local_10 = local_10 + local_28;
          }
        }
        else {
          anon_unknown_4::convertBayerGB
                    ((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,(uint8_t *)in_RCX,
                     (uint8_t *)CONCAT17(uVar8,CONCAT16(uVar7,in_stack_fffffffffffffed8)),
                     (uint8_t *)in_stack_fffffffffffffed0,greenfirst_00,uVar9);
          if (local_8 != (undefined1 *)0x0) {
            local_8 = local_8 + local_28 * 3;
          }
          if (local_10 != (uint8_t *)0x0) {
            local_10 = local_10 + local_28;
          }
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(in_RCX);
      goto LAB_0013e824;
    }
    if (in_RCX != (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x10800c6) {
      if (in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x20c005a)
      {
        local_58 = (in_R8 >> 2) * 6 + in_stack_00000008;
        for (local_60 = 0; local_60 < local_30; local_60 = local_60 + 1) {
          for (local_68 = 0; local_68 < local_28; local_68 = local_68 + 4) {
            if (local_8 != (undefined1 *)0x0) {
              convYCbCr411toQuadRGB
                        (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         in_stack_fffffffffffffef4);
              for (local_78 = 0; local_78 < 0xc; local_78 = local_78 + 1) {
                *local_8 = local_74[local_78];
                local_8 = local_8 + 1;
              }
            }
            if (local_10 != (uint8_t *)0x0) {
              local_80 = (local_68 >> 2) * 6;
              *local_10 = *(uint8_t *)((long)local_18 + local_80);
              local_10[1] = *(uint8_t *)((long)local_18 + local_80 + 1);
              puVar5 = local_10 + 3;
              local_10[2] = *(uint8_t *)((long)local_18 + local_80 + 3);
              local_10 = local_10 + 4;
              *puVar5 = *(uint8_t *)((long)local_18 + local_80 + 4);
            }
          }
          local_18 = (void *)(local_58 + (long)local_18);
        }
        goto LAB_0013e824;
      }
      if ((in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x2100032
          ) || (in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          0x210003b)) {
        local_88 = (in_R8 >> 2) * 8 + in_stack_00000008;
        for (local_90 = 0; local_90 < local_30; local_90 = local_90 + 1) {
          for (local_98 = 0; local_98 < local_28; local_98 = local_98 + 4) {
            if (local_8 != (undefined1 *)0x0) {
              convYCbCr422toQuadRGB
                        ((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8,(int)((ulong)in_RCX >> 0x20));
              for (local_a8 = 0; local_a8 < 0xc; local_a8 = local_a8 + 1) {
                *local_8 = local_a4[local_a8];
                local_8 = local_8 + 1;
              }
            }
            if (local_10 != (uint8_t *)0x0) {
              lVar3 = (local_98 >> 2) * 8;
              *local_10 = *(uint8_t *)((long)local_18 + lVar3);
              local_10[1] = *(uint8_t *)((long)local_18 + lVar3 + 2);
              puVar5 = local_10 + 3;
              local_10[2] = *(uint8_t *)((long)local_18 + lVar3 + 4);
              local_10 = local_10 + 4;
              *puVar5 = *(uint8_t *)((long)local_18 + lVar3 + 6);
            }
          }
          local_18 = (void *)(local_88 + (long)local_18);
        }
        goto LAB_0013e824;
      }
      if (in_RCX == (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x2180014)
      {
        for (local_b8 = 0; local_b8 < local_30; local_b8 = local_b8 + 1) {
          if (local_8 != (undefined1 *)0x0) {
            memcpy(local_8,local_18,local_28 * 3);
            local_8 = local_8 + local_28 * 3;
          }
          if (local_10 != (uint8_t *)0x0) {
            local_c0 = 0;
            for (local_c8 = 0; local_c8 < local_28; local_c8 = local_c8 + 1) {
              uVar2 = anon_unknown_4::rgb2Grey
                                (*(uint8_t *)((long)local_18 + local_c0),
                                 *(uint8_t *)((long)local_18 + local_c0 + 1),
                                 *(uint8_t *)((long)local_18 + local_c0 + 2));
              *local_10 = uVar2;
              local_c0 = local_c0 + 3;
              local_10 = local_10 + 1;
            }
          }
          local_18 = (void *)(local_28 * 3 + in_stack_00000008 + (long)local_18);
        }
        goto LAB_0013e824;
      }
      if (in_RCX != (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x81080001
         ) {
        local_31 = 0;
        goto LAB_0013e824;
      }
    }
  }
  for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
    if (local_8 != (undefined1 *)0x0) {
      for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
        local_49 = *(undefined1 *)((long)local_18 + local_48);
        *local_8 = local_49;
        puVar4 = local_8 + 2;
        local_8[1] = local_49;
        local_8 = local_8 + 3;
        *puVar4 = local_49;
      }
    }
    if (local_10 != (uint8_t *)0x0) {
      memcpy(local_10,local_18,local_28);
      local_10 = local_10 + local_28;
    }
    local_18 = (void *)(local_28 + in_stack_00000008 + (long)local_18);
  }
LAB_0013e824:
  return (bool)(local_31 & 1);
}

Assistant:

bool convertImage(uint8_t *rgb_out, uint8_t *mono_out, const uint8_t *raw, uint64_t pixelformat,
  size_t width, size_t height, size_t xpadding)
{
  bool ret=true;

  switch (pixelformat)
  {
    case Mono8:
    case Confidence8:
    case Error8:
      {
        for (size_t k=0; k<height; k++)
        {
          if (rgb_out)
          {
            for (size_t i=0; i<width; i++)
            {
              uint8_t v=raw[i];
              *rgb_out++ = v;
              *rgb_out++ = v;
              *rgb_out++ = v;
            }
          }

          if (mono_out)
          {
            std::memcpy(mono_out, raw, width*sizeof(uint8_t));
            mono_out+=width;
          }

          raw+=width+xpadding;
        }
      }
      break;

    case YCbCr411_8:
      {
        size_t pstep=(width>>2)*6+xpadding;
        for (size_t k=0; k<height; k++)
        {
          for (size_t i=0; i<width; i+=4)
          {
            if (rgb_out)
            {
              uint8_t rgb[12];
              convYCbCr411toQuadRGB(rgb, raw, static_cast<int>(i));

              for (int j=0; j<12; j++)
              {
                *rgb_out++ = rgb[j];
              }
            }

            if (mono_out)
            {
              size_t j=(i>>2)*6;
              *mono_out++ = raw[j];
              *mono_out++ = raw[j+1];
              *mono_out++ = raw[j+3];
              *mono_out++ = raw[j+4];
            }
          }

          raw+=pstep;
        }
      }
      break;

    case YCbCr422_8:
    case YUV422_8:
      {
        size_t pstep=(width>>2)*8+xpadding;
        for (size_t k=0; k<height; k++)
        {
          for (size_t i=0; i<width; i+=4)
          {
            if (rgb_out)
            {
              uint8_t rgb[12];
              convYCbCr422toQuadRGB(rgb, raw, static_cast<int>(i));

              for (int j=0; j<12; j++)
              {
                *rgb_out++ = rgb[j];
              }
            }

            if (mono_out)
            {
              size_t j=(i>>2)*8;
              *mono_out++ = raw[j];
              *mono_out++ = raw[j+2];
              *mono_out++ = raw[j+4];
              *mono_out++ = raw[j+6];
            }
          }

          raw+=pstep;
        }
      }
      break;

    case RGB8:
      {
        for (size_t k=0; k<height; k++)
        {
          if (rgb_out)
          {
            std::memcpy(rgb_out, raw, 3*width*sizeof(uint8_t));
            rgb_out+=3*width;
          }

          if (mono_out)
          {
            size_t j=0;
            for (size_t i=0; i<width; i++)
            {
              *mono_out++ = rgb2Grey(raw[j], raw[j+1], raw[j+2]);
              j+=3;
            }
          }

          raw+=3*width+xpadding;
        }
      }
      break;

    case BayerRG8:
    case BayerBG8:
    case BayerGR8:
    case BayerGB8:
      {
        // In every row, every second pixel is green and every other pixel is
        // either red or blue. This flag specifies if the current row is red or
        // blue.

        bool greenfirst=(pixelformat == BayerGR8 || pixelformat == BayerGB8);
        bool red=(pixelformat == BayerRG8 || pixelformat == BayerGR8);

        // setup temporary buffer that is 1 pixel larger than the image

        std::unique_ptr<uint8_t []> buffer(new uint8_t [(width+2)*3]);
        uint8_t *row[3];

        row[0]=buffer.get();
        row[1]=row[0]+width+2;
        row[2]=row[1]+width+2;

        // initialize buffer with 2 rows, extended by two pixel to avoid a special
        // treatment for the image border

        memcpy(row[1]+1, raw+width+xpadding, width*sizeof(uint8_t));
        memcpy(row[2]+1, raw, width*sizeof(uint8_t));

        row[1][0]=row[1][2]; row[1][width+1]=row[1][width-1];
        row[2][0]=row[2][2]; row[2][width+1]=row[2][width-1];

        // for all rows

        for (size_t k=0; k<height; k++)
        {
          // store next extended row in buffer

          if (k+1 < height)
          {
            uint8_t *p=row[0];
            row[0]=row[1];
            row[1]=row[2];
            row[2]=p;

            memcpy(row[2]+1, raw+(k+1)*(width+xpadding), width*sizeof(uint8_t));

            row[2][0]=row[2][2]; row[2][width+1]=row[2][width-1];
          }

          if (red)
          {
            convertBayerGR(rgb_out, mono_out, row[0], row[1], row[2], greenfirst, width);

            if (rgb_out) rgb_out+=3*width;
            if (mono_out) mono_out+=width;
          }
          else
          {
            convertBayerGB(rgb_out, mono_out, row[0], row[1], row[2], greenfirst, width);

            if (rgb_out) rgb_out+=3*width;
            if (mono_out) mono_out+=width;
          }

          greenfirst=!greenfirst;
          red=!red;
        }
      }
      break;

    default:
      ret=false;
      break;
  }

  return ret;
}